

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool absl::lts_20240722::flags_internal::anon_unknown_0::ReadFlagsFromEnv
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *flag_names,
               vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               *input_args,bool fail_on_absent_in_env)

{
  pointer *ppAVar1;
  pointer pbVar2;
  pointer __first;
  undefined8 uVar3;
  int iVar4;
  char *__s;
  ulong uVar5;
  pointer __result;
  pointer pAVar6;
  ulong uVar7;
  _Tp_alloc_type *__alloc;
  bool bVar8;
  _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
  *this;
  AlphaNum *__args;
  long lVar9;
  pointer pbVar10;
  string envval;
  string envname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_168 [48];
  char *local_138;
  char local_130 [9];
  undefined7 uStack_127;
  undefined1 local_118 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  AlphaNum local_e0;
  AlphaNum local_b0;
  undefined1 local_80 [80];
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (AlphaNum *)0x10e317;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[1]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
             (char (*) [1])0x10e317);
  pbVar10 = (flag_names->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (flag_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 != pbVar2) {
    bVar8 = true;
    do {
      iVar4 = std::__cxx11::string::compare((char *)pbVar10);
      if (iVar4 == 0) {
LAB_0010a1a8:
        local_b0.piece_._M_len = 0x1b;
        local_b0.piece_._M_str = "Infinite recursion on flag ";
        local_e0.piece_._M_str = (pbVar10->_M_dataplus)._M_p;
        local_e0.piece_._M_len = pbVar10->_M_string_length;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_168,&local_b0);
        __args = (AlphaNum *)local_168._0_8_;
        absl::lts_20240722::flags_internal::ReportUsageError(local_168._8_8_,local_168._0_8_,1);
        if ((AlphaNum *)local_168._0_8_ != (AlphaNum *)(local_168 + 0x10)) {
          __args = (AlphaNum *)(local_168._16_8_ + 1);
          operator_delete((void *)local_168._0_8_,(ulong)__args);
        }
        bVar8 = false;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)pbVar10);
        if (iVar4 == 0) goto LAB_0010a1a8;
        local_b0.piece_._M_len = 6;
        local_b0.piece_._M_str = "FLAGS_";
        local_e0.piece_._M_str = (pbVar10->_M_dataplus)._M_p;
        local_e0.piece_._M_len = pbVar10->_M_string_length;
        __args = &local_b0;
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_118,__args);
        uVar3 = local_118._0_8_;
        local_130[0] = '\0';
        local_130[1] = '\0';
        local_130[2] = '\0';
        local_130[3] = '\0';
        local_130[4] = '\0';
        local_130[5] = '\0';
        local_130[6] = '\0';
        local_130[7] = '\0';
        local_130[8] = 0;
        local_138 = local_130 + 8;
        __s = getenv((char *)local_118._0_8_);
        if (__s == (char *)0x0) {
          if (fail_on_absent_in_env) {
            local_b0.piece_._M_len = local_118._8_8_;
            local_b0.piece_._M_str = (char *)uVar3;
            local_e0.piece_._M_len = 0x19;
            local_e0.piece_._M_str = " not found in environment";
            absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_168,&local_b0);
            __args = (AlphaNum *)local_168._0_8_;
            absl::lts_20240722::flags_internal::ReportUsageError(local_168._8_8_,local_168._0_8_,1);
            if ((AlphaNum *)local_168._0_8_ != (AlphaNum *)(local_168 + 0x10)) {
              __args = (AlphaNum *)(local_168._16_8_ + 1);
              operator_delete((void *)local_168._0_8_,(ulong)__args);
            }
            bVar8 = false;
          }
        }
        else {
          strlen(__s);
          std::__cxx11::string::_M_replace((ulong)&local_138,0,(char *)0x0,(ulong)__s);
          local_b0.piece_._M_len = 2;
          local_b0.piece_._M_str = "--";
          local_e0.piece_._M_str = (pbVar10->_M_dataplus)._M_p;
          local_e0.piece_._M_len = pbVar10->_M_string_length;
          local_168._0_8_ = (AlphaNum *)0x1;
          local_168._8_8_ = "=";
          local_80[0x20] = local_130[0];
          local_80[0x21] = local_130[1];
          local_80[0x22] = local_130[2];
          local_80[0x23] = local_130[3];
          local_80[0x24] = local_130[4];
          local_80[0x25] = local_130[5];
          local_80[0x26] = local_130[6];
          local_80[0x27] = local_130[7];
          local_80._40_8_ = local_138;
          __args = (AlphaNum *)local_80;
          absl::lts_20240722::StrCat_abi_cxx11_(__args,&local_b0,&local_e0,(AlphaNum *)local_168);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
          if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
            __args = (AlphaNum *)(local_80._16_8_ + 1);
            operator_delete((void *)local_80._0_8_,(ulong)__args);
          }
        }
        if (local_138 != local_130 + 8) {
          __args = (AlphaNum *)(CONCAT71(uStack_127,local_130[8]) + 1);
          operator_delete(local_138,(ulong)__args);
        }
        if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
          __args = (AlphaNum *)(local_118._16_8_ + 1);
          operator_delete((void *)local_118._0_8_,(ulong)__args);
        }
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar2);
    if (!bVar8) {
      bVar8 = false;
      goto LAB_0010a3ff;
    }
  }
  pAVar6 = (input_args->
           super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar6 == (input_args->
                super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (input_args->
              super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)pAVar6 - (long)__first;
    if (lVar9 == 0x7fffffffffffffe0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = lVar9 >> 5;
    uVar7 = 1;
    if (pAVar6 != __first) {
      uVar7 = uVar5;
    }
    this = (_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
            *)(uVar7 + uVar5);
    if ((_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
         *)0x3fffffffffffffe < this) {
      this = (_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
              *)0x3ffffffffffffff;
    }
    __alloc = (_Tp_alloc_type *)(uVar7 + uVar5);
    if (CARRY8(uVar7,uVar5)) {
      this = (_Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
              *)0x3ffffffffffffff;
    }
    __result = std::
               _Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               ::_M_allocate(this,(size_t)__args);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(lVar9 + (long)__result),&local_f8);
    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      *)(lVar9 + (long)__result))[1].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pAVar6 = std::
             vector<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
             ::_S_relocate(__first,pAVar6,__result,__alloc);
    if (__first != (pointer)0x0) {
      operator_delete(__first,(long)(input_args->
                                    super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
                                    )._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first);
    }
    (input_args->
    super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
    )._M_impl.super__Vector_impl_data._M_start = __result;
    (input_args->
    super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
    )._M_impl.super__Vector_impl_data._M_finish = pAVar6 + 1;
    (input_args->
    super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&pAVar6->args_,&local_f8);
    pAVar6->next_arg_ = 0;
    ppAVar1 = &(input_args->
               super__Vector_base<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList,_std::allocator<absl::lts_20240722::flags_internal::(anonymous_namespace)::ArgsList>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  bVar8 = true;
LAB_0010a3ff:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  return bVar8;
}

Assistant:

bool ReadFlagsFromEnv(const std::vector<std::string>& flag_names,
                      std::vector<ArgsList>& input_args,
                      bool fail_on_absent_in_env) {
  bool success = true;
  std::vector<std::string> args;

  // This argument represents fake argv[0], which should be present in all arg
  // lists.
  args.emplace_back("");

  for (const auto& flag_name : flag_names) {
    // Avoid infinite recursion.
    if (flag_name == "fromenv" || flag_name == "tryfromenv") {
      flags_internal::ReportUsageError(
          absl::StrCat("Infinite recursion on flag ", flag_name), true);

      success = false;
      continue;
    }

    const std::string envname = absl::StrCat("FLAGS_", flag_name);
    std::string envval;
    if (!GetEnvVar(envname.c_str(), envval)) {
      if (fail_on_absent_in_env) {
        flags_internal::ReportUsageError(
            absl::StrCat(envname, " not found in environment"), true);

        success = false;
      }

      continue;
    }

    args.push_back(absl::StrCat("--", flag_name, "=", envval));
  }

  if (success) {
    input_args.emplace_back(args);
  }

  return success;
}